

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::may_read_undefined_variable_in_block
          (Compiler *this,SPIRBlock *block,uint32_t var)

{
  ushort uVar1;
  long lVar2;
  uint32_t *puVar3;
  byte bVar4;
  ulong in_RCX;
  uint uVar5;
  ulong uVar6;
  Instruction *instr;
  Instruction *pIVar7;
  
  instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  pIVar7 = instr + (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  do {
    bVar4 = (byte)in_RCX;
    if (instr == pIVar7) {
LAB_00258cd6:
      return (bool)(instr == pIVar7 | bVar4 & 1);
    }
    puVar3 = stream(this,instr);
    uVar1 = instr->op;
    in_RCX = (ulong)uVar1;
    uVar5 = uVar1 - 0x39;
    if (uVar5 < 0xb) {
      in_RCX = (long)&switchD_00258c46::switchdataD_002987cc +
               (long)(int)(&switchD_00258c46::switchdataD_002987cc)[uVar5];
      switch((uint)uVar1) {
      case 0x39:
        uVar5 = instr->length;
        in_RCX = (ulong)uVar5;
        if (2 < uVar5) {
          in_RCX = (ulong)(uVar5 - 3);
          uVar6 = 0;
          while (in_RCX != uVar6) {
            lVar2 = uVar6 + 3;
            uVar6 = uVar6 + 1;
            if (puVar3[lVar2] == var) goto LAB_00258cd4;
          }
        }
        break;
      case 0x3d:
      case 0x41:
      case 0x42:
      case 0x43:
switchD_00258c46_caseD_3d:
        if (puVar3[2] == var) {
LAB_00258cd4:
          bVar4 = 1;
          goto LAB_00258cd6;
        }
        break;
      case 0x3e:
      case 0x3f:
switchD_00258c46_caseD_3e:
        if (*puVar3 == var) {
          bVar4 = 0;
          goto LAB_00258cd6;
        }
      }
    }
    else {
      if (uVar1 == 0x53) goto switchD_00258c46_caseD_3d;
      if (uVar1 == 0xa9) {
        in_RCX = 1;
        bVar4 = 1;
        if ((puVar3[3] == var) || (puVar3[4] == var)) goto LAB_00258cd6;
      }
      else if (uVar1 == 0xf5) {
        uVar5 = instr->length;
        in_RCX = (ulong)uVar5;
        if (1 < uVar5) {
          in_RCX = (ulong)(uVar5 - 2);
          uVar6 = 0;
          while (uVar6 < in_RCX) {
            lVar2 = uVar6 + 2;
            uVar6 = uVar6 + 2;
            if (puVar3[lVar2] == var) goto LAB_00258cd4;
          }
        }
      }
      else {
        if (uVar1 == 0x1169) goto switchD_00258c46_caseD_3d;
        if (uVar1 == 0x116a) goto switchD_00258c46_caseD_3e;
      }
    }
    instr = instr + 1;
  } while( true );
}

Assistant:

bool Compiler::may_read_undefined_variable_in_block(const SPIRBlock &block, uint32_t var)
{
	for (auto &op : block.ops)
	{
		auto *ops = stream(op);
		switch (op.op)
		{
		case OpStore:
		case OpCooperativeMatrixStoreKHR:
		case OpCopyMemory:
			if (ops[0] == var)
				return false;
			break;

		case OpAccessChain:
		case OpInBoundsAccessChain:
		case OpPtrAccessChain:
			// Access chains are generally used to partially read and write. It's too hard to analyze
			// if all constituents are written fully before continuing, so just assume it's preserved.
			// This is the same as the parameter preservation analysis.
			if (ops[2] == var)
				return true;
			break;

		case OpSelect:
			// Variable pointers.
			// We might read before writing.
			if (ops[3] == var || ops[4] == var)
				return true;
			break;

		case OpPhi:
		{
			// Variable pointers.
			// We might read before writing.
			if (op.length < 2)
				break;

			uint32_t count = op.length - 2;
			for (uint32_t i = 0; i < count; i += 2)
				if (ops[i + 2] == var)
					return true;
			break;
		}

		case OpCopyObject:
		case OpLoad:
		case OpCooperativeMatrixLoadKHR:
			if (ops[2] == var)
				return true;
			break;

		case OpFunctionCall:
		{
			if (op.length < 3)
				break;

			// May read before writing.
			uint32_t count = op.length - 3;
			for (uint32_t i = 0; i < count; i++)
				if (ops[i + 3] == var)
					return true;
			break;
		}

		default:
			break;
		}
	}

	// Not accessed somehow, at least not in a usual fashion.
	// It's likely accessed in a branch, so assume we must preserve.
	return true;
}